

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O3

bool DynamicProfileStorage::LoadCacheCatalog(void)

{
  code *pcVar1;
  Type pDVar2;
  bool bVar3;
  bool bVar4;
  int32 iVar5;
  uint uVar6;
  undefined4 *puVar7;
  DWORD DVar8;
  char16 *local_88;
  char16 *url;
  StorageInfo newInfo;
  DWORD len;
  uint local_60;
  uint local_5c;
  DWORD magic;
  DWORD version;
  DynamicProfileStorageReaderWriter catalogFile;
  uint local_38;
  uint local_34;
  DWORD time;
  DWORD count;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x380,"(enabled)","enabled");
    if (!bVar3) goto LAB_0096cffb;
    *puVar7 = 0;
  }
  if (useCacheDir == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x381,"(useCacheDir)","useCacheDir");
    if (!bVar3) goto LAB_0096cffb;
    *puVar7 = 0;
  }
  if (locked == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x382,"(locked)","locked");
    if (!bVar3) goto LAB_0096cffb;
    *puVar7 = 0;
  }
  _magic = (char16 *)0x0;
  catalogFile.filename = (char16 *)0x0;
  bVar3 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)&magic,catalogFilename,L"rb",false,
                     (errno_t *)0x0);
  if (bVar3) {
    bVar3 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)&magic,&local_60,1);
    if ((((bVar3) &&
         (bVar3 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)&magic,&local_5c,1), bVar3)) &&
        (bVar3 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                           ((DynamicProfileStorageReaderWriter *)&magic,&local_38,1), bVar3)) &&
       (bVar3 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                          ((DynamicProfileStorageReaderWriter *)&magic,&local_34,1),
       1 < local_5c && (local_60 == 0x132b5ae && bVar3))) {
      if (2 < local_5c) {
        DisableCacheDir();
        Output::Print(L"ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n")
        ;
        Output::Flush();
        bVar3 = false;
        goto LAB_0096cc12;
      }
      if (useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                           ,0x3a8,"(useCacheDir)","useCacheDir");
        if (!bVar3) goto LAB_0096cffb;
        *puVar7 = 0;
      }
      if (creationTime == (ulong)local_38) {
        DVar8 = infoMap.count - infoMap.freeCount;
        if (local_34 < DVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3ad,"(count >= start)","count >= start");
          if (!bVar3) goto LAB_0096cffb;
          *puVar7 = 0;
        }
        iVar5 = DynamicProfileStorageReaderWriter::Size((DynamicProfileStorageReaderWriter *)&magic)
        ;
        if (iVar5 < lastOffset) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3ae,"(catalogFile.Size() >= lastOffset)",
                             "catalogFile.Size() >= lastOffset");
          if (!bVar3) goto LAB_0096cffb;
          *puVar7 = 0;
        }
        if (local_34 == nextFileId) {
          iVar5 = DynamicProfileStorageReaderWriter::Size
                            ((DynamicProfileStorageReaderWriter *)&magic);
          bVar3 = true;
          if (iVar5 != lastOffset) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x3b1,"(catalogFile.Size() == lastOffset)",
                               "catalogFile.Size() == lastOffset");
            if (!bVar4) {
LAB_0096cffb:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar7 = 0;
          }
          goto LAB_0096cc12;
        }
        bVar3 = DynamicProfileStorageReaderWriter::Seek
                          ((DynamicProfileStorageReaderWriter *)&magic,lastOffset);
        if (!bVar3) {
          DynamicProfileStorageReaderWriter::Close
                    ((DynamicProfileStorageReaderWriter *)&magic,false);
          Output::Print(L"ERROR: DynamicProfileStorage: Unable to seek to last known offset\n");
          Output::Flush();
          bVar3 = CreateCacheCatalog();
          goto LAB_0096cc12;
        }
      }
      else if (creationTime == 0) {
        DVar8 = 0;
      }
      else {
        DVar8 = 0;
        Output::Print(L"WARNING: DynamicProfileStorage: Reloading full catalog\n");
        Output::Flush();
      }
      if (DVar8 < local_34) {
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          bVar3 = DynamicProfileStorageReaderWriter::ReadUtf8String
                            ((DynamicProfileStorageReaderWriter *)&magic,&local_88,
                             (DWORD *)((long)&newInfo.field_1 + 4));
          if (!bVar3) {
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfileStoragePhase);
            if (bVar3) {
              Output::Print(
                           L"TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: \'%s\'\n"
                           );
              Output::Flush();
            }
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)&magic,false);
            bVar3 = CreateCacheCatalog();
            goto LAB_0096cc12;
          }
          uVar6 = JsUtil::
                  BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                  ::FindEntryWithKey<char16_t*>
                            ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                              *)&infoMap,&local_88);
          pDVar2 = infoMap.entries;
          if ((int)uVar6 < 0) {
            url._0_1_ = 1;
            newInfo._0_4_ = DVar8;
            JsUtil::
            BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                        *)&infoMap,&local_88,(StorageInfo *)&url);
          }
          else {
            if (infoMap.entries[uVar6].
                super_CacheHashedEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo>.
                super_ValueEntry<DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>_>
                .
                super_KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>
                .value.isFileStorage == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x3d8,"(oldInfo->isFileStorage)","oldInfo->isFileStorage");
              if (!bVar3) goto LAB_0096cffb;
              *puVar7 = 0;
            }
            pDVar2[uVar6].
            super_CacheHashedEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo>.
            super_ValueEntry<DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>_>
            .super_KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>.
            value.field_1.fileId = DVar8;
          }
          DVar8 = DVar8 + 1;
        } while (DVar8 < local_34);
      }
      if ((creationTime == 0) &&
         (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfileStoragePhase), bVar3))
      {
        Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog loaded: \'%s\'\n",
                      catalogFilename);
        Output::Flush();
      }
      nextFileId = local_34;
      creationTime = (TimeType)local_38;
      lastOffset = DynamicProfileStorageReaderWriter::Size
                             ((DynamicProfileStorageReaderWriter *)&magic);
      bVar3 = true;
      goto LAB_0096cc12;
    }
    DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)&magic,false);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfileStoragePhase);
    if (bVar3) {
      Output::Print(L"TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: \'%s\'\n"
                    ,catalogFilename);
      Output::Flush();
    }
  }
  bVar3 = CreateCacheCatalog();
LAB_0096cc12:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)&magic);
  return bVar3;
}

Assistant:

bool DynamicProfileStorage::LoadCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    DynamicProfileStorageReaderWriter catalogFile;
    DWORD magic;
    DWORD version;
    DWORD count;
    DWORD time;
    if (!catalogFile.Init(catalogFilename, _u("rb"), false))
    {
        return CreateCacheCatalog();
    }
    if (!catalogFile.Read(&magic)
        || !catalogFile.Read(&version)
        || !catalogFile.Read(&time)
        || !catalogFile.Read(&count)
        || magic != MagicNumber
        || version < FileFormatVersion)
    {
        catalogFile.Close();
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        return CreateCacheCatalog();
    }

    if (version > FileFormatVersion)
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n"));
        Output::Flush();
        return false;
    }

    DWORD start = 0;

    AssertOrFailFast(useCacheDir);
    if (time == creationTime)
    {
        // We can reuse existing data
        start = infoMap.Count();
        AssertOrFailFast(count >= start);
        AssertOrFailFast(catalogFile.Size() >= lastOffset);
        if (count == nextFileId)
        {
            AssertOrFailFast(catalogFile.Size() == lastOffset);
            return true;
        }

        if (!catalogFile.Seek(lastOffset))
        {
            catalogFile.Close();
            Output::Print(_u("ERROR: DynamicProfileStorage: Unable to seek to last known offset\n"));
            Output::Flush();
            return CreateCacheCatalog();
        }
    }
    else if (creationTime != 0)
    {
        Output::Print(_u("WARNING: DynamicProfileStorage: Reloading full catalog\n"));
        Output::Flush();
    }

    for (DWORD i = start; i < count; i++)
    {
        DWORD len;
        char16 * url;
        if (!catalogFile.ReadUtf8String(&url, &len))
        {
#if DBG_DUMP
            if (DynamicProfileStorage::DoTrace())
            {
                Output::Print(_u("TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: '%s'\n"), catalogFilename);
                Output::Flush();
            }
#endif
            // REVIEW: the file is corrupted, should we not flush the cache totally?
            catalogFile.Close();
            return CreateCacheCatalog();
        }

        StorageInfo * oldInfo;
        if (infoMap.TryGetReference(url, &oldInfo))
        {
            AssertOrFailFast(oldInfo->isFileStorage);
            oldInfo->fileId = i;
        }
        else
        {
            StorageInfo newInfo;
            newInfo.isFileStorage = true;
            newInfo.fileId = i;
            infoMap.Add(url, newInfo);
        }
    }

#if DBG_DUMP
    if (creationTime == 0 && DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog loaded: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif

    nextFileId = count;
    creationTime = time;
    lastOffset = catalogFile.Size();
    return true;
}